

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

QString * __thiscall QNetworkProxy::user(QNetworkProxy *this)

{
  bool bVar1;
  QString *in_RDI;
  QString *this_00;
  
  this_00 = in_RDI;
  bVar1 = ::QSharedDataPointer::operator_cast_to_bool
                    ((QSharedDataPointer<QNetworkProxyPrivate> *)0x24abbd);
  if (bVar1) {
    QSharedDataPointer<QNetworkProxyPrivate>::operator->
              ((QSharedDataPointer<QNetworkProxyPrivate> *)0x24abcd);
    QString::QString(this_00,in_RDI);
  }
  else {
    QString::QString((QString *)0x24abe8);
  }
  return this_00;
}

Assistant:

QString QNetworkProxy::user() const
{
    return d ? d->user : QString();
}